

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::SerializeWithCachedSizes
          (GeneratedCodeInfo_Annotation *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  char *data;
  string *value;
  UnknownFieldSet *unknown_fields;
  int local_40;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  GeneratedCodeInfo_Annotation *this_local;
  
  iVar2 = path_size(this);
  if (0 < iVar2) {
    internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    io::CodedOutputStream::WriteVarint32(output,this->_path_cached_byte_size_);
  }
  local_40 = 0;
  iVar2 = path_size(this);
  for (; local_40 < iVar2; local_40 = local_40 + 1) {
    iVar3 = path(this,local_40);
    internal::WireFormatLite::WriteInt32NoTag(iVar3,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    source_file_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    source_file_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,iVar2,SERIALIZE,"google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    value = source_file_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(2,value,output);
  }
  if ((uVar1 & 2) != 0) {
    iVar3 = begin(this);
    internal::WireFormatLite::WriteInt32(3,iVar3,output);
  }
  if ((uVar1 & 4) != 0) {
    iVar3 = end(this);
    internal::WireFormatLite::WriteInt32(4,iVar3,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = GeneratedCodeInfo_Annotation::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_path_cached_byte_size_);
  }
  for (int i = 0, n = this->path_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->path(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source_file().data(), this->source_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->source_file(), output);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->begin(), output);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(4, this->end(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.GeneratedCodeInfo.Annotation)
}